

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O1

void __thiscall Network::compute_triangles(Network *this)

{
  uint uVar1;
  ulong uVar2;
  
  this->total_triangles = 0;
  if ((int)((ulong)((long)(this->node_list).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->node_list).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) != 0) {
    uVar2 = 0;
    do {
      uVar1 = compute_triangles(this,(uint)uVar2);
      (this->triangle_count).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_start[uVar2] = uVar1;
      this->total_triangles = this->total_triangles + uVar1;
      uVar2 = uVar2 + 1;
    } while (uVar2 < ((ulong)((long)(this->node_list).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->node_list).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff));
  }
  return;
}

Assistant:

void compute_triangles() {
        total_triangles = 0;
        for (unsigned int node_i = 0; node_i < getN(); node_i++) {
            triangle_count[node_i] = compute_triangles(node_i);
            total_triangles += triangle_count[node_i];
        }
    }